

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# columnref_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::ColumnRefExpression::GetName_abi_cxx11_
          (string *__return_storage_ptr__,ColumnRefExpression *this)

{
  const_reference pvVar1;
  
  if ((this->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
    pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::back(&this->column_names);
  }
  else {
    pvVar1 = &(this->super_ParsedExpression).super_BaseExpression.alias;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  return __return_storage_ptr__;
}

Assistant:

string ColumnRefExpression::GetName() const {
	return !alias.empty() ? alias : column_names.back();
}